

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_display_options.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  ALLEGRO_FONT *pAVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int extraout_EAX;
  int iVar7;
  undefined4 uVar8;
  ALLEGRO_DISPLAY *display;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  long lVar12;
  ALLEGRO_DISPLAY *pAVar13;
  char **ppcVar14;
  int i;
  ulong uVar15;
  int *piVar16;
  char *pcVar17;
  bool bVar18;
  int iVar19;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  float fVar25;
  undefined4 uVar26;
  ALLEGRO_DISPLAY_MODE mode;
  ALLEGRO_EVENT event;
  undefined8 uStack_e8;
  ulong uStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  char *pcStack_c8;
  undefined8 local_88;
  int local_78 [8];
  uint local_58;
  int local_54;
  int local_38;
  
  cVar3 = al_install_system(0x5020700,atexit);
  if (cVar3 == '\0') {
    pcVar17 = "Could not init Allegro.\n";
  }
  else {
    ppcVar14 = flag_names;
    uVar15 = 0;
    piVar16 = &DAT_00104040;
    do {
      if ((uVar15 < 0xb) && ((0x677U >> ((uint)uVar15 & 0x1f) & 1) != 0)) {
        *ppcVar14 = (char *)((long)&DAT_00104040 + (long)*piVar16);
      }
      uVar15 = uVar15 + 1;
      piVar16 = piVar16 + 1;
      ppcVar14 = ppcVar14 + 1;
    } while (uVar15 != 0x20);
    al_init_primitives_addon();
    uVar21 = 0x3f800000;
    fVar25 = 0.0;
    uVar9 = al_map_rgba_f(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
    white.b = (float)uVar21;
    white.r = (float)(int)uVar9;
    white.g = (float)(int)((ulong)uVar9 >> 0x20);
    white.a = fVar25;
    al_install_keyboard();
    al_install_mouse();
    al_init_font_addon();
    display = (ALLEGRO_DISPLAY *)al_create_display(800,600);
    if (display != (ALLEGRO_DISPLAY *)0x0) {
      load_font();
      uVar9 = al_create_timer(0x11111111);
      modes_count = al_get_num_display_modes();
      options_count = 0x18;
      uVar10 = al_get_current_display();
      iVar4 = al_get_display_height(uVar10);
      visible_rows = iVar4 / font_h + -10;
      al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
      al_clear_to_color();
      display_options(display);
      al_flip_display();
      uVar10 = al_create_event_queue();
      uVar11 = al_get_keyboard_event_source();
      al_register_event_source(uVar10,uVar11);
      uVar11 = al_get_mouse_event_source();
      al_register_event_source(uVar10,uVar11);
      uVar11 = al_get_display_event_source(display);
      al_register_event_source(uVar10,uVar11);
      uVar11 = al_get_timer_event_source(uVar9);
      al_register_event_source(uVar10,uVar11);
      al_start_timer(uVar9);
      al_wait_for_event(uVar10,local_78);
      if (local_78[0] != 0x2a) {
        bVar18 = false;
        do {
          if ((local_78[0] == 0x15) && (local_38 == 1)) {
            iVar5 = al_get_display_width(display);
            iVar4 = (local_54 + -10) / font_h;
            iVar5 = (int)local_58 / (iVar5 / 2);
            if ((iVar5 == 0) && (0 < iVar4)) {
              piVar16 = &selected_mode;
              iVar7 = 0;
              if (modes_count < iVar4 + -1) goto LAB_0010271d;
LAB_0010273a:
              selected_column = iVar7;
              *piVar16 = iVar4 + -1;
              bVar18 = true;
            }
            else {
LAB_0010271d:
              if ((iVar5 == 1) && (0 < iVar4)) {
                piVar16 = &selected_option;
                iVar7 = 1;
                if (iVar4 <= options_count) goto LAB_0010273a;
              }
            }
          }
          if ((local_78[0] == 0x1e) && (uVar6 = al_get_display_flags(display), uVar6 != flags)) {
            old_flags = old_flags | uVar6;
            bVar18 = true;
            flags = uVar6;
          }
          if (local_78[0] != 0xb) goto LAB_00102898;
          switch(local_58) {
          case 0x52:
            selected_column = 0;
            goto LAB_0010282a;
          case 0x53:
            selected_column = 1;
LAB_0010282a:
            bVar18 = true;
            break;
          case 0x54:
            bVar18 = true;
            if (selected_column == 1) {
              selected_option = selected_option + -1;
            }
            else if (selected_column == 0) {
              selected_mode = selected_mode + -1;
            }
            break;
          case 0x55:
            bVar18 = true;
            if (selected_column == 1) {
              selected_option = selected_option + 1;
            }
            else if (selected_column == 0) {
              selected_mode = selected_mode + 1;
            }
            break;
          default:
            if (local_58 == 0x43) {
              if (selected_column == 0) {
                if (selected_mode < 2) {
                  local_88 = 0x25800000320;
                  uVar9 = 1;
                  if (selected_mode == 1) {
                    uVar9 = 0x200;
                  }
                }
                else {
                  al_get_display_mode(selected_mode + -2,&local_88);
                  uVar9 = 2;
                }
                al_set_new_display_flags(uVar9);
                al_destroy_font(font);
                font = (ALLEGRO_FONT *)0x0;
                pAVar13 = (ALLEGRO_DISPLAY *)al_create_display(local_88 & 0xffffffff,local_88._4_4_)
                ;
                if (pAVar13 == (ALLEGRO_DISPLAY *)0x0) {
                  builtin_strncpy(status + 0x10," failed.",9);
                }
                else {
                  al_destroy_display(display);
                  al_set_target_backbuffer(pAVar13);
                  uVar9 = al_get_display_event_source(pAVar13);
                  al_register_event_source(uVar10,uVar9);
                  uVar9 = al_get_current_display();
                  iVar4 = al_get_display_height(uVar9);
                  visible_rows = iVar4 / font_h + -10;
                  builtin_strncpy(status + 0x10," succeeded.",0xc);
                  display = pAVar13;
                }
                builtin_strncpy(status,"Display creation",0x10);
                load_font();
              }
              bVar18 = true;
              if (selected_column == 1) {
                lVar12 = (long)selected_option;
                options[lVar12].required =
                     ((options[lVar12].required + 1) / 3) * -3 + options[lVar12].required + 1;
                al_set_new_display_option(options[lVar12].option,options[lVar12].value);
              }
            }
            else if (local_58 == 0x3b) goto LAB_0010268f;
          }
          if (((local_58 & 0xfffffffe) == 0x50) && (selected_column == 1)) {
            uVar6 = (uint)(local_58 == 0x50);
            if (local_58 == 0x51) {
              uVar6 = 0xffffffff;
            }
            lVar12 = (long)selected_option;
            iVar4 = uVar6 + options[lVar12].value;
            if (iVar4 < 1) {
              iVar4 = 0;
            }
            options[lVar12].value = iVar4;
            iVar5 = options[lVar12].max_value;
            if (iVar5 < iVar4) {
              options[lVar12].value = iVar5;
              iVar4 = iVar5;
            }
            al_set_new_display_option(options[lVar12].option,iVar4,options[lVar12].required);
            bVar18 = true;
          }
LAB_00102898:
          if (selected_mode < 0) {
            selected_mode = 0;
          }
          if (modes_count + 1 < selected_mode) {
            selected_mode = modes_count + 1;
          }
          if (selected_option < 0) {
            selected_option = 0;
          }
          if (options_count <= selected_option) {
            selected_option = options_count + -1;
          }
          if (selected_mode < first_visible_row) {
            first_visible_row = selected_mode;
          }
          if (first_visible_row + visible_rows <= selected_mode) {
            first_visible_row = (selected_mode - visible_rows) + 1;
          }
          if (bVar18) {
            cVar3 = al_is_event_queue_empty(uVar10);
            bVar18 = true;
            if (cVar3 != '\0') {
              al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
              al_clear_to_color();
              display_options(display);
              al_flip_display();
              goto LAB_0010294c;
            }
          }
          else {
LAB_0010294c:
            bVar18 = false;
          }
          al_wait_for_event(uVar10,local_78);
        } while (local_78[0] != 0x2a);
      }
LAB_0010268f:
      al_destroy_font(font);
      return 0;
    }
    pcVar17 = "Could not create display.\n";
  }
  abort_example(pcVar17);
  font = (ALLEGRO_FONT *)al_create_builtin_font();
  if (font != (ALLEGRO_FONT *)0x0) {
    font_h = al_get_font_line_height(font);
    return extraout_EAX;
  }
  pcVar17 = "Error creating builtin font\n";
  abort_example("Error creating builtin font\n");
  uStack_d0 = (ulong)(uint)options_count;
  iVar4 = al_get_display_width();
  pcStack_c8 = pcVar17;
  iVar5 = al_get_display_height(pcVar17);
  modes_count = al_get_num_display_modes();
  al_map_rgb_f(0x3f4ccccd,0x3f4ccccd,0x3f800000);
  al_draw_textf(font,0,"Create new display");
  if (first_visible_row < modes_count + 2) {
    iVar19 = font_h + 10;
    iVar7 = first_visible_row;
    do {
      if (visible_rows + first_visible_row <= iVar7) break;
      if (iVar7 < 2) {
        uStack_e8 = 0x25800000320;
        uStack_e0 = 0;
      }
      else {
        al_get_display_mode(iVar7 + -2,&uStack_e8);
      }
      if ((selected_column == 0) && (iVar7 == selected_mode)) {
        uVar22 = 0x3f800000;
        uVar21 = al_map_rgb_f(0x3f800000,0x3f800000,0);
        al_set_blender(0,1,0);
        al_draw_filled_rectangle
                  (0x41200000,(float)iVar19,0x439b0000,(float)(font_h + iVar19),uVar21,uVar22);
      }
      uVar23 = 0;
      uVar26 = 0;
      uVar22 = al_map_rgb_f(0,0,0);
      uVar21 = extraout_XMM0_Dc;
      al_set_blender(0,1,3);
      if ((iVar7 < 1 || iVar7 != first_visible_row) &&
         ((iVar7 != first_visible_row + visible_rows + -1 || (modes_count < iVar7)))) {
        pcVar17 = "FS Window";
        if (iVar7 == 0) {
          pcVar17 = "Windowed";
        }
        if (1 < iVar7) {
          pcVar17 = "Fullscreen";
        }
        al_draw_textf(uVar22,uVar23,0x41200000,(float)iVar19,font,0,"%s %d x %d (fmt: %x, %d Hz)",
                      pcVar17,uStack_e8 & 0xffffffff,uStack_e8._4_4_,uStack_e0 & 0xffffffff,
                      uStack_e0 >> 0x20,uVar23,uVar26,uVar22,uVar21);
      }
      else {
        al_draw_textf(uVar22,uVar23,0x41200000,(float)iVar19,font,0,"...");
      }
      iVar19 = iVar19 + font_h;
      bVar18 = iVar7 <= modes_count;
      iVar7 = iVar7 + 1;
    } while (bVar18);
  }
  uStack_d8 = (ulong)(uint)(iVar4 / 2);
  uVar23 = 0x3f4ccccd;
  uVar26 = 0;
  uVar22 = al_map_rgb_f(0x3f4ccccd,0x3f4ccccd,0x3f800000);
  fVar25 = (float)(int)(iVar4 / 2 + 10);
  uVar21 = extraout_XMM0_Dc_00;
  al_draw_textf(font,0,"Options for new display");
  al_draw_textf(uVar22,uVar23,(float)(iVar4 + -10),0x41200000,font,2,"(current display)");
  if (0 < (int)uStack_d0) {
    iVar7 = (int)uStack_d8;
    iVar19 = font_h + 10;
    piVar16 = &options[0].required;
    uVar15 = 0;
    do {
      if ((selected_column == 1) && (uVar15 == (uint)selected_option)) {
        uVar23 = 0x3f800000;
        uVar26 = 0;
        uVar22 = al_map_rgb_f(0x3f800000,0x3f800000,0);
        uVar21 = extraout_XMM0_Dc_01;
        al_draw_filled_rectangle
                  (fVar25,(float)iVar19,(float)(iVar7 + 0x136),(float)(font_h + iVar19));
      }
      iVar1 = *piVar16;
      uVar20 = 0x3f000000;
      uVar8 = uVar22;
      if (iVar1 == 0) {
        uVar24 = 0x3f000000;
        uVar22 = 0x3f000000;
LAB_00102ec2:
        uVar22 = al_map_rgb_f(uVar20,uVar24,uVar22);
      }
      else {
        if (iVar1 == 2) {
          uVar20 = 0;
          uVar24 = 0;
          uVar22 = 0;
          goto LAB_00102ec2;
        }
        uVar24 = uVar23;
        if (iVar1 == 1) {
          uVar24 = 0;
          uVar22 = 0;
          uVar20 = 0x3f000000;
          goto LAB_00102ec2;
        }
      }
      pcVar17 = "ignored";
      if (*piVar16 == 2) {
        pcVar17 = "suggested";
      }
      if (*piVar16 == 1) {
        pcVar17 = "required";
      }
      al_draw_textf(uVar22,uVar24,fVar25,font,0,"%s: %d (%s)",
                    ((anon_struct_24_5_b24d3c67 *)(piVar16 + -5))->name,piVar16[-2],pcVar17,uVar8,
                    uVar21,uVar23,uVar26);
      uVar23 = 0x3f000000;
      uVar26 = 0;
      uVar22 = al_map_rgb_f(0x3f666666,0x3f000000,0x3e99999a);
      pAVar2 = font;
      uVar21 = extraout_XMM0_Dc_02;
      uVar8 = al_get_display_option(pcStack_c8,piVar16[-3]);
      al_draw_textf(uVar22,uVar23,(float)(iVar4 + -10),(float)iVar19,pAVar2,2,"%d",uVar8);
      iVar19 = iVar19 + font_h;
      uVar15 = uVar15 + 1;
      piVar16 = piVar16 + 6;
    } while (uStack_d0 != uVar15);
  }
  uVar22 = 0;
  uVar21 = al_map_rgb_f(0,0,0x3f4ccccd);
  iVar4 = font_h * -2;
  lVar12 = 0;
  al_draw_textf(font,0,"PageUp/Down: modify values");
  iVar4 = (iVar5 + iVar4 + -10) - font_h;
  al_draw_textf(uVar21,uVar22,0x41200000,(float)iVar4,font,0,"Return: set mode or require option");
  al_draw_textf(uVar21,uVar22,0x41200000,(float)(iVar4 - font_h),font,0,
                "Cursor keys: change selection");
  ppcVar14 = flag_names;
  do {
    if (*ppcVar14 != (char *)0x0) {
      if (((uint)flags >> ((uint)lVar12 & 0x1f) & 1) == 0) {
        if ((old_flags & 1 << ((byte)lVar12 & 0x1f)) == 0) goto LAB_001030fc;
        uVar21 = 0x3ecccccd;
        uVar22 = 0x3ecccccd;
      }
      else {
        uVar21 = 0;
        uVar22 = 0;
      }
      al_map_rgb_f(0x3f000000,uVar21,uVar22);
      al_draw_text(font,0,*ppcVar14);
      al_get_text_width(font);
    }
LAB_001030fc:
    lVar12 = lVar12 + 1;
    ppcVar14 = ppcVar14 + 1;
    if (lVar12 == 0x20) {
      al_map_rgb_f(0x3f800000,0,0);
      iVar4 = al_draw_text(font,1,status);
      return iVar4;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_TIMER *timer;
   bool redraw = false;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   init_flags();
   al_init_primitives_addon();
   
   white = al_map_rgba_f(1, 1, 1, 1);

   al_install_keyboard();
   al_install_mouse();
   al_init_font_addon();

   display = al_create_display(800, 600);
   if (!display) {
      abort_example("Could not create display.\n");
   }

   load_font();

   timer = al_create_timer(1.0 / 60);

   modes_count = al_get_num_display_modes();
   options_count = sizeof(options) / sizeof(options[0]);
   
   update_ui();
   
   al_clear_to_color(al_map_rgb_f(1, 1, 1));
   display_options(display);
   al_flip_display();

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_mouse_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_timer_event_source(timer));
   
   al_start_timer(timer);

   while (1) {
      ALLEGRO_EVENT event;
      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
      if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_DOWN) {
         if (event.mouse.button == 1) {
            int dw = al_get_display_width(display);
            int y = 10;
            int row = (event.mouse.y - y) / font_h - 1;
            int column = event.mouse.x / (dw / 2);
            if (column == 0) {
               if (row >= 0 && row <= modes_count) {
                  selected_column = column;
                  selected_mode = row;
                  redraw = true;
               }
            }
            if (column == 1) {
               if (row >= 0 && row < options_count) {
                  selected_column = column;
                  selected_option = row;
                  redraw = true;
               }
            }
         }
      }
      if (event.type == ALLEGRO_EVENT_TIMER) {
          int f = al_get_display_flags(display);
          if (f != flags) {
              redraw = true;
              flags = f;
              old_flags |= f;
          }
      }
      if (event.type == ALLEGRO_EVENT_KEY_CHAR) {
         int change;
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
            break;
         if (event.keyboard.keycode == ALLEGRO_KEY_LEFT) {
            selected_column = 0;
            redraw = true;
         }
         if (event.keyboard.keycode == ALLEGRO_KEY_RIGHT) {
            selected_column = 1;
            redraw = true;
         }
         if (event.keyboard.keycode == ALLEGRO_KEY_UP) {
            if (selected_column == 0) selected_mode -= 1;
            if (selected_column == 1) selected_option -= 1;
            redraw = true;
         }
         if (event.keyboard.keycode == ALLEGRO_KEY_DOWN) {
            if (selected_column == 0) selected_mode += 1;
            if (selected_column == 1) selected_option += 1;
            redraw = true;
         }
         if (event.keyboard.keycode == ALLEGRO_KEY_ENTER) {
             if (selected_column == 0) {
                ALLEGRO_DISPLAY_MODE mode;
                ALLEGRO_DISPLAY *new_display;
                if (selected_mode > 1) {
                    al_get_display_mode(selected_mode - 2, &mode);
                    al_set_new_display_flags(ALLEGRO_FULLSCREEN);
                }
                else if (selected_mode == 1) {
                    mode.width = 800;
                    mode.height = 600;
                    al_set_new_display_flags(ALLEGRO_FULLSCREEN_WINDOW);
                }
                else {
                    mode.width = 800;
                    mode.height = 600;
                    al_set_new_display_flags(ALLEGRO_WINDOWED);
                }

                al_destroy_font(font);
                font = NULL;

                new_display = al_create_display(
                   mode.width, mode.height);
                if (new_display) {
                   al_destroy_display(display);
                   display = new_display;
                   al_set_target_backbuffer(display);
                   al_register_event_source(queue,
                      al_get_display_event_source(display));
                   update_ui();
                   sprintf(status, "Display creation succeeded.");
                }
                else {
                   sprintf(status, "Display creation failed.");
                }

                load_font();
             }
             if (selected_column == 1) {
                 options[selected_option].required += 1;
                 options[selected_option].required %= 3;
                 al_set_new_display_option(
                    options[selected_option].option,
                    options[selected_option].value,
                    options[selected_option].required);
             }
             redraw = true;
         }
         change = 0;
         if (event.keyboard.keycode == ALLEGRO_KEY_PGUP) change = 1;
         if (event.keyboard.keycode == ALLEGRO_KEY_PGDN) change = -1;
         if (change && selected_column == 1) {
            options[selected_option].value += change;
            if (options[selected_option].value < 0)
               options[selected_option].value = 0;
            if (options[selected_option].value >
               options[selected_option].max_value)
               options[selected_option].value =
                  options[selected_option].max_value;
            al_set_new_display_option(options[selected_option].option,
               options[selected_option].value,
               options[selected_option].required);
            redraw = true;
         }
      }
      
      if (selected_mode < 0) selected_mode = 0;
      if (selected_mode > modes_count + 1)
         selected_mode = modes_count + 1;
      if (selected_option < 0) selected_option = 0;
      if (selected_option >= options_count)
         selected_option = options_count - 1;
      if (selected_mode < first_visible_row)
         first_visible_row = selected_mode;
      if (selected_mode > first_visible_row + visible_rows - 1)
         first_visible_row = selected_mode - visible_rows + 1;

      if (redraw && al_is_event_queue_empty(queue)) {
         redraw = false;
         al_clear_to_color(al_map_rgb_f(1, 1, 1));
         display_options(display);
         al_flip_display();
      }
   }

   al_destroy_font(font);

   return 0;
}